

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::anon_unknown_16::UTF16NFDIterator::nextRawCodePoint(UTF16NFDIterator *this)

{
  UChar UVar1;
  UChar *pUVar2;
  uint local_1c;
  UChar trail;
  UChar32 c;
  UTF16NFDIterator *this_local;
  
  if (this->s == this->limit) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    pUVar2 = this->s;
    this->s = pUVar2 + 1;
    local_1c = (uint)(ushort)*pUVar2;
    if ((this->limit == (UChar *)0x0) && (local_1c == 0)) {
      this->s = (UChar *)0x0;
      this_local._4_4_ = 0xffffffff;
    }
    else {
      if (((local_1c & 0xfffffc00) == 0xd800) &&
         ((this->s != this->limit && (UVar1 = *this->s, (UVar1 & 0xfc00U) == 0xdc00)))) {
        this->s = this->s + 1;
        local_1c = local_1c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
      }
      this_local._4_4_ = local_1c;
    }
  }
  return this_local._4_4_;
}

Assistant:

virtual UChar32 nextRawCodePoint() {
        if(s == limit) { return U_SENTINEL; }
        UChar32 c = *s++;
        if(limit == NULL && c == 0) {
            s = NULL;
            return U_SENTINEL;
        }
        UChar trail;
        if(U16_IS_LEAD(c) && s != limit && U16_IS_TRAIL(trail = *s)) {
            ++s;
            c = U16_GET_SUPPLEMENTARY(c, trail);
        }
        return c;
    }